

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

_Bool tb_cmp(uc_struct_conflict15 *uc,void *ap,void *bp)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 local_31;
  TranslationBlock_conflict *b;
  TranslationBlock_conflict *a;
  void *bp_local;
  void *ap_local;
  uc_struct_conflict15 *uc_local;
  
  local_31 = false;
  if (((*ap == *bp) && (local_31 = false, *(int *)((long)ap + 4) == *(int *)((long)bp + 4))) &&
     (local_31 = false, *(int *)((long)ap + 8) == *(int *)((long)bp + 8))) {
    uVar1 = tb_cflags((TranslationBlock_conflict *)ap);
    uVar2 = tb_cflags((TranslationBlock_conflict *)bp);
    local_31 = false;
    if ((((uVar1 & 0xff0affff) == (uVar2 & 0xff0affff)) &&
        (local_31 = false, *(int *)((long)ap + 0x14) == *(int *)((long)bp + 0x14))) &&
       (local_31 = false, *(long *)((long)ap + 0x40) == *(long *)((long)bp + 0x40))) {
      local_31 = *(long *)((long)ap + 0x48) == *(long *)((long)bp + 0x48);
    }
  }
  return local_31;
}

Assistant:

static bool tb_cmp(struct uc_struct *uc, const void *ap, const void *bp)
{
    const TranslationBlock *a = ap;
    const TranslationBlock *b = bp;

    return a->pc == b->pc &&
        a->cs_base == b->cs_base &&
        a->flags == b->flags &&
        (tb_cflags(a) & CF_HASH_MASK) == (tb_cflags(b) & CF_HASH_MASK) &&
        a->trace_vcpu_dstate == b->trace_vcpu_dstate &&
        a->page_addr[0] == b->page_addr[0] &&
        a->page_addr[1] == b->page_addr[1];
}